

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_get_name(exr_const_context_t ctxt,int part_index,char **out)

{
  _internal_exr_part *p_Var1;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RDX == (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->print_error)(in_RDI,3,"NULL output for \'name\'");
      }
      else if (p_Var1->name == (exr_attribute_t *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = 0xf;
      }
      else if (p_Var1->name->type == EXR_ATTR_STRING) {
        *in_RDX = (((p_Var1->name->field_6).box2i)->max).field_0;
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = 0;
      }
      else {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->print_error)
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'name\'",
                             p_Var1->name->type_name);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_name (exr_const_context_t ctxt, int part_index, const char** out)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!out)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "NULL output for 'name'"));

    if (part->name)
    {
        if (part->name->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'name'",
                part->name->type_name));
        *out = part->name->string->str;
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_NO_ATTR_BY_NAME);
}